

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void ppc_POWER10_cpu_family_class_init(CPUClass *oc,void *data)

{
  oc[1].do_interrupt = ppc_pvr_match_power10;
  oc[1].do_unaligned_access =
       (_func_void_CPUState_ptr_vaddr_MMUAccessType_int_uintptr_t_conflict *)0x1e;
  oc[1].get_arch_id = (_func_int64_t_CPUState_ptr_conflict *)0x3e;
  oc[1].cpu_exec_interrupt = init_proc_POWER10;
  oc[1].adjust_watchpoint_address = check_pow_nocheck;
  oc->has_work = cpu_has_work_POWER10;
  oc[1].get_memory_mapping =
       (_func_void_CPUState_ptr_MemoryMappingList_ptr_conflict *)0x8000600fc1ff7ae1;
  oc[1].set_pc = (_func_void_CPUState_ptr_vaddr_conflict *)0xbfffe;
  oc[1].synchronize_from_tb =
       (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x900000010280ff37;
  oc[1].tlb_fill =
       (_func__Bool_CPUState_ptr_vaddr_int_MMUAccessType_int__Bool_uintptr_t_conflict *)
       0x7070400003f7fe1b;
  oc[1].tlb_fill_cpu =
       (_func__Bool_CPUState_ptr_vaddr_int_MMUAccessType_int__Bool_uintptr_t_conflict *)0x1f000;
  *(undefined4 *)&oc[1].get_phys_page_debug = 0x10005;
  oc[1].tcg_initialize = ppc64_v3_handle_mmu_fault;
  oc[1].debug_excp_handler = (_func_void_CPUState_ptr_conflict *)&ppc_hash64_opts_POWER7;
  oc[1].cpu_exec_enter = (_func_void_CPUState_ptr_conflict *)&POWER10_radix_page_info;
  *(undefined4 *)&oc[1].cpu_exec_exit = 0x38;
  *(undefined8 *)((long)&oc[1].get_phys_page_debug + 4) = 0x600000010;
  *(undefined4 *)((long)&oc[1].get_phys_page_attrs_debug + 4) = 0x1e0492;
  *(undefined8 *)((long)&oc[1].asidx_from_attrs + 4) = 0x800000008000;
  oc[2].reset = ppc_cpu_interrupts_big_endian_lpcr;
  return;
}

Assistant:

POWERPC_FAMILY(POWER10)(CPUClass *oc, void *data)
{
    PowerPCCPUClass *pcc = POWERPC_CPU_CLASS(oc);
    CPUClass *cc = CPU_CLASS(oc);

//    dc->fw_name = "PowerPC,POWER10";
//    dc->desc = "POWER10";
    pcc->pvr_match = ppc_pvr_match_power10;
    pcc->pcr_mask = PCR_COMPAT_2_05 | PCR_COMPAT_2_06 | PCR_COMPAT_2_07 |
                    PCR_COMPAT_3_00;
    pcc->pcr_supported = PCR_COMPAT_3_10 | PCR_COMPAT_3_00 | PCR_COMPAT_2_07 |
                         PCR_COMPAT_2_06 | PCR_COMPAT_2_05;
    pcc->init_proc = init_proc_POWER10;
    pcc->check_pow = check_pow_nocheck;
    cc->has_work = cpu_has_work_POWER10;
    pcc->insns_flags = PPC_INSNS_BASE | PPC_ISEL | PPC_STRING | PPC_MFTB |
                       PPC_FLOAT | PPC_FLOAT_FSEL | PPC_FLOAT_FRES |
                       PPC_FLOAT_FSQRT | PPC_FLOAT_FRSQRTE |
                       PPC_FLOAT_FRSQRTES |
                       PPC_FLOAT_STFIWX |
                       PPC_FLOAT_EXT |
                       PPC_CACHE | PPC_CACHE_ICBI | PPC_CACHE_DCBZ |
                       PPC_MEM_SYNC | PPC_MEM_EIEIO |
                       PPC_MEM_TLBSYNC |
                       PPC_64B | PPC_64H | PPC_64BX | PPC_ALTIVEC |
                       PPC_SEGMENT_64B | PPC_SLBI |
                       PPC_POPCNTB | PPC_POPCNTWD |
                       PPC_CILDST;
    pcc->insns_flags2 = PPC2_VSX | PPC2_VSX207 | PPC2_DFP | PPC2_DBRX |
                        PPC2_PERM_ISA206 | PPC2_DIVE_ISA206 |
                        PPC2_ATOMIC_ISA206 | PPC2_FP_CVT_ISA206 |
                        PPC2_FP_TST_ISA206 | PPC2_BCTAR_ISA207 |
                        PPC2_LSQ_ISA207 | PPC2_ALTIVEC_207 |
                        PPC2_ISA205 | PPC2_ISA207S | PPC2_FP_CVT_S64 |
                        PPC2_TM | PPC2_ISA300 | PPC2_PRCNTL;
    pcc->msr_mask = (1ull << MSR_SF) |
                    (1ull << MSR_HV) |
                    (1ull << MSR_TM) |
                    (1ull << MSR_VR) |
                    (1ull << MSR_VSX) |
                    (1ull << MSR_EE) |
                    (1ull << MSR_PR) |
                    (1ull << MSR_FP) |
                    (1ull << MSR_ME) |
                    (1ull << MSR_FE0) |
                    (1ull << MSR_SE) |
                    (1ull << MSR_DE) |
                    (1ull << MSR_FE1) |
                    (1ull << MSR_IR) |
                    (1ull << MSR_DR) |
                    (1ull << MSR_PMM) |
                    (1ull << MSR_RI) |
                    (1ull << MSR_LE);
    pcc->lpcr_mask = LPCR_VPM1 | LPCR_ISL | LPCR_KBV | LPCR_DPFD |
        (LPCR_PECE_U_MASK & LPCR_HVEE) | LPCR_ILE | LPCR_AIL |
        LPCR_UPRT | LPCR_EVIRT | LPCR_ONL | LPCR_HR | LPCR_LD |
        (LPCR_PECE_L_MASK & (LPCR_PDEE | LPCR_HDEE | LPCR_EEE |
                             LPCR_DEE | LPCR_OEE))
        | LPCR_MER | LPCR_GTSE | LPCR_TC |
        LPCR_HEIC | LPCR_LPES0 | LPCR_HVICE | LPCR_HDICE;
    pcc->lpcr_pm = LPCR_PDEE | LPCR_HDEE | LPCR_EEE | LPCR_DEE | LPCR_OEE;
    pcc->mmu_model = POWERPC_MMU_3_00;
    pcc->handle_mmu_fault = ppc64_v3_handle_mmu_fault;
    /* segment page size remain the same */
    pcc->hash64_opts = &ppc_hash64_opts_POWER7;
    pcc->radix_page_info = &POWER10_radix_page_info;
    pcc->lrg_decr_bits = 56;
    pcc->excp_model = POWERPC_EXCP_POWER9;
    pcc->bus_model = PPC_FLAGS_INPUT_POWER9;
    pcc->flags = POWERPC_FLAG_VRE | POWERPC_FLAG_SE |
                 POWERPC_FLAG_BE | POWERPC_FLAG_PMM |
                 POWERPC_FLAG_BUS_CLK | POWERPC_FLAG_CFAR |
                 POWERPC_FLAG_VSX | POWERPC_FLAG_TM;
    pcc->l1_dcache_size = 0x8000;
    pcc->l1_icache_size = 0x8000;
    pcc->interrupts_big_endian = ppc_cpu_interrupts_big_endian_lpcr;
}